

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O2

void MemoryProfiler::PrintCurrentThread(void)

{
  MemoryProfiler *this;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_013e5c50);
  this = (MemoryProfiler *)*puVar1;
  Output::Print(
               L"========================================================================================================\n"
               );
  Output::Print(L"Memory Profile (Current thread)\n");
  if (this != (MemoryProfiler *)0x0) {
    Print(this);
  }
  Output::Flush();
  return;
}

Assistant:

void
MemoryProfiler::PrintCurrentThread()
{
    MemoryProfiler* instance = NULL;
    instance = MemoryProfiler::Instance;

    Output::Print(_u("========================================================================================================\n"));
    Output::Print(_u("Memory Profile (Current thread)\n"));
    if (instance != nullptr)
    {
        instance->Print();
    }

    Output::Flush();
}